

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

long __thiscall FileReaderBZ2::Read(FileReaderBZ2 *this,void *buffer,long len)

{
  uint uVar1;
  uint uVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  (this->Stream).next_out = (char *)buffer;
  (this->Stream).avail_out = (uint)len;
  do {
    uVar1 = BZ2_bzDecompress(&this->Stream);
    if (((this->Stream).avail_in == 0) && (this->SawEOF == false)) {
      uVar2 = (*(this->File->super_FileReaderBase)._vptr_FileReaderBase[2])
                        (this->File,this->InBuff,0x1000);
      if (CONCAT44(extraout_var,uVar2) < 0x1000) {
        this->SawEOF = true;
      }
      (this->Stream).next_in = (char *)this->InBuff;
      (this->Stream).avail_in = uVar2;
    }
    uVar2 = (this->Stream).avail_out;
  } while ((uVar1 == 0) && (uVar2 != 0));
  if ((uVar1 & 0xfffffffb) != 0) {
    I_Error("Corrupt bzip2 stream");
    uVar2 = (this->Stream).avail_out;
  }
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    I_Error("Ran out of data in bzip2 stream");
    uVar3 = (ulong)(this->Stream).avail_out;
  }
  return len - uVar3;
}

Assistant:

long FileReaderBZ2::Read (void *buffer, long len)
{
	int err;

	Stream.next_out = (char *)buffer;
	Stream.avail_out = len;

	do
	{
		err = BZ2_bzDecompress(&Stream);
		if (Stream.avail_in == 0 && !SawEOF)
		{
			FillBuffer ();
		}
	} while (err == BZ_OK && Stream.avail_out != 0);

	if (err != BZ_OK && err != BZ_STREAM_END)
	{
		I_Error ("Corrupt bzip2 stream");
	}

	if (Stream.avail_out != 0)
	{
		I_Error ("Ran out of data in bzip2 stream");
	}

	return len - Stream.avail_out;
}